

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::UpdateTimeFirstKey(LegacyScriptPubKeyMan *this,int64_t nCreateTime)

{
  long lVar1;
  element_type *in_RSI;
  ScriptPubKeyMan *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RSI,(char *)in_RDI,in_stack_ffffffffffffffdc,
             (AnnotatedMixin<std::recursive_mutex> *)0xa1868a);
  if ((long)in_RSI < 2) {
    in_RDI[9].NotifyWatchonlyChanged._pimpl.px = (element_type *)0x1;
  }
  else if ((in_RDI[9].NotifyWatchonlyChanged._pimpl.px == (element_type *)0x7fffffffffffffff) ||
          ((long)in_RSI < (long)in_RDI[9].NotifyWatchonlyChanged._pimpl.px)) {
    in_RDI[9].NotifyWatchonlyChanged._pimpl.px = in_RSI;
  }
  boost::signals2::
  signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
  ::operator()((signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
                *)in_RSI,in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void LegacyScriptPubKeyMan::UpdateTimeFirstKey(int64_t nCreateTime)
{
    AssertLockHeld(cs_KeyStore);
    if (nCreateTime <= 1) {
        // Cannot determine birthday information, so set the wallet birthday to
        // the beginning of time.
        nTimeFirstKey = 1;
    } else if (nTimeFirstKey == UNKNOWN_TIME || nCreateTime < nTimeFirstKey) {
        nTimeFirstKey = nCreateTime;
    }

    NotifyFirstKeyTimeChanged(this, nTimeFirstKey);
}